

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlFinishDocument(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  endDocumentSAXFunc p_Var2;
  xmlDocPtr cur;
  uint uVar3;
  int iVar4;
  
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
     (p_Var2 = ctxt->sax->endDocument, p_Var2 != (endDocumentSAXFunc)0x0)) {
    (*p_Var2)(ctxt->userData);
  }
  cur = ctxt->myDoc;
  if (cur != (xmlDocPtr)0x0) {
    if (ctxt->wellFormed != 0) {
      uVar1 = cur->properties;
      uVar3 = uVar1 | 1;
      cur->properties = uVar3;
      if (ctxt->valid != 0) {
        uVar3 = uVar1 | 9;
        cur->properties = uVar3;
      }
      if (ctxt->nsWellFormed != 0) {
        cur->properties = uVar3 | 2;
      }
    }
    if ((ctxt->options & 0x20000) != 0) {
      *(byte *)&cur->properties = (byte)cur->properties | 4;
    }
    iVar4 = xmlStrEqual(cur->version,(xmlChar *)"SAX compatibility mode document");
    if (iVar4 != 0) {
      xmlFreeDoc(cur);
      ctxt->myDoc = (xmlDocPtr)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlFinishDocument(xmlParserCtxtPtr ctxt) {
    xmlDocPtr doc;

    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    doc = ctxt->myDoc;
    if (doc != NULL) {
        if (ctxt->wellFormed) {
            doc->properties |= XML_DOC_WELLFORMED;
            if (ctxt->valid)
                doc->properties |= XML_DOC_DTDVALID;
            if (ctxt->nsWellFormed)
                doc->properties |= XML_DOC_NSVALID;
        }

        if (ctxt->options & XML_PARSE_OLD10)
            doc->properties |= XML_DOC_OLD10;

        /*
         * Remove locally kept entity definitions if the tree was not built
         */
	if (xmlStrEqual(doc->version, SAX_COMPAT_MODE)) {
            xmlFreeDoc(doc);
            ctxt->myDoc = NULL;
        }
    }
}